

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O1

int secp256k1_ec_seckey_tweak_mul(secp256k1_context *ctx,uchar *seckey,uchar *tweak32)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  undefined1 auVar4 [16];
  unsigned_long _zzq_result;
  int overflow;
  int vflag;
  unsigned_long _zzq_args [6];
  secp256k1_scalar factor;
  int local_b0;
  uint local_ac;
  undefined8 local_a8;
  secp256k1_scalar *local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  secp256k1_scalar local_58;
  
  local_b0 = 0;
  if (ctx == (secp256k1_context *)0x0) {
    secp256k1_ec_seckey_tweak_mul_cold_3();
  }
  else if (seckey != (uchar *)0x0) {
    if (tweak32 == (uchar *)0x0) {
      secp256k1_ec_seckey_tweak_mul_cold_1();
      return 0;
    }
    secp256k1_scalar_set_b32(&local_58,tweak32,&local_b0);
    uVar2 = secp256k1_scalar_set_b32_seckey((secp256k1_scalar *)local_78,seckey);
    iVar1 = local_b0;
    secp256k1_scalar_verify(&local_58);
    if ((local_58.d[1] == 0 && local_58.d[3] == 0) && (local_58.d[0] == 0 && local_58.d[2] == 0)) {
      uVar2 = 0;
    }
    if (iVar1 != 0) {
      uVar2 = 0;
    }
    secp256k1_scalar_mul((secp256k1_scalar *)local_78,(secp256k1_scalar *)local_78,&local_58);
    local_ac = uVar2 ^ 1;
    secp256k1_scalar_verify(&secp256k1_scalar_zero);
    local_a8 = 0x4d430005;
    local_98 = 0x20;
    local_90 = 0;
    local_88 = 0;
    local_80 = 0;
    lVar3 = (long)(int)local_ac + -1;
    auVar4._8_4_ = (int)lVar3;
    auVar4._0_8_ = lVar3;
    auVar4._12_4_ = (int)((ulong)lVar3 >> 0x20);
    local_78 = local_78 & auVar4;
    local_68 = auVar4 & local_68;
    local_a0 = (secp256k1_scalar *)local_78;
    secp256k1_scalar_verify((secp256k1_scalar *)local_78);
    secp256k1_scalar_get_b32(seckey,(secp256k1_scalar *)local_78);
    return uVar2;
  }
  secp256k1_ec_seckey_tweak_mul_cold_2();
  return 0;
}

Assistant:

int secp256k1_ec_seckey_tweak_mul(const secp256k1_context* ctx, unsigned char *seckey, const unsigned char *tweak32) {
    secp256k1_scalar factor;
    secp256k1_scalar sec;
    int ret = 0;
    int overflow = 0;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(seckey != NULL);
    ARG_CHECK(tweak32 != NULL);

    secp256k1_scalar_set_b32(&factor, tweak32, &overflow);
    ret = secp256k1_scalar_set_b32_seckey(&sec, seckey);
    ret &= (!overflow) & secp256k1_eckey_privkey_tweak_mul(&sec, &factor);
    secp256k1_scalar_cmov(&sec, &secp256k1_scalar_zero, !ret);
    secp256k1_scalar_get_b32(seckey, &sec);

    secp256k1_scalar_clear(&sec);
    secp256k1_scalar_clear(&factor);
    return ret;
}